

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void initAtomList(void)

{
  if (CM_TRANSPORT_ATOM == 0) {
    CM_TRANSPORT_ATOM = attr_atom_from_string("CM_TRANSPORT");
    IP_INTERFACE_ATOM = attr_atom_from_string("IP_INTERFACE");
    IP_PORT_ATOM = attr_atom_from_string("IP_PORT");
    IP_ADDR_ATOM = attr_atom_from_string("IP_ADDR");
    IP_HOST_ATOM = attr_atom_from_string("IP_HOST");
    SST_GROUP_ID_ATOM = attr_atom_from_string("SST_GROUP_ID");
    CM_ENET_CONN_TIMEOUT = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
    SST_GROUP_ID_ATOM = attr_atom_from_string("SST_GROUP_ID");
  }
  return;
}

Assistant:

static void initAtomList()
{
    if (CM_TRANSPORT_ATOM)
        return;

    CM_TRANSPORT_ATOM = attr_atom_from_string("CM_TRANSPORT");
    IP_INTERFACE_ATOM = attr_atom_from_string("IP_INTERFACE");
    IP_PORT_ATOM = attr_atom_from_string("IP_PORT");
    IP_ADDR_ATOM = attr_atom_from_string("IP_ADDR");
    IP_HOST_ATOM = attr_atom_from_string("IP_HOST");
    SST_GROUP_ID_ATOM = attr_atom_from_string("SST_GROUP_ID");
    CM_ENET_CONN_TIMEOUT = attr_atom_from_string("CM_ENET_CONN_TIMEOUT");
    SST_GROUP_ID_ATOM = attr_atom_from_string("SST_GROUP_ID");
}